

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

uint32_t secp256k1_scalar_get_bits_var(secp256k1_scalar *a,uint offset,uint count)

{
  byte bVar1;
  uint uVar2;
  uint32_t extraout_EAX;
  uint32_t extraout_EAX_00;
  secp256k1_ge *a_00;
  uint uVar3;
  undefined4 in_register_00000034;
  secp256k1_gej *a_01;
  secp256k1_ge *a_02;
  secp256k1_ge *a_03;
  secp256k1_fe sStack_b0;
  secp256k1_fe sStack_80;
  ulong uStack_50;
  
  a_01 = (secp256k1_gej *)CONCAT44(in_register_00000034,offset);
  a_02 = (secp256k1_ge *)a;
  secp256k1_scalar_verify(a);
  if (count - 0x21 < 0xffffffe0) {
    secp256k1_scalar_get_bits_var_cold_3();
  }
  else if (count + offset < 0x101) {
    uVar3 = (count + offset) - 1 >> 6;
    uVar2 = offset >> 6;
    if (uVar3 == uVar2) {
      secp256k1_scalar_verify(a);
      uVar2 = (uint)(a->d[uVar3] >> ((byte)offset & 0x3f));
LAB_00147160:
      return (uVar2 << (-(char)count & 0x1fU)) >> (-(char)count & 0x1fU);
    }
    if (offset < 0xc0) {
      bVar1 = (byte)offset & 0x3f;
      uVar2 = (uint)(a->d[uVar2] >> bVar1) | (uint)(a->d[(ulong)uVar2 + 1] << 0x40 - bVar1);
      goto LAB_00147160;
    }
    goto LAB_0014717d;
  }
  secp256k1_scalar_get_bits_var_cold_2();
LAB_0014717d:
  secp256k1_scalar_get_bits_var_cold_1();
  uStack_50 = (ulong)count;
  secp256k1_gej_verify(a_01);
  a_03 = a_00;
  secp256k1_fe_verify(&a_00->x);
  if (a_01->infinity == 0) {
    secp256k1_fe_sqr(&sStack_80,&a_00->x);
    secp256k1_fe_mul(&sStack_b0,&sStack_80,&a_00->x);
    secp256k1_fe_mul(&a_02->x,&a_01->x,&sStack_80);
    secp256k1_fe_mul(&a_02->y,&a_01->y,&sStack_b0);
    a_02->infinity = a_01->infinity;
    secp256k1_ge_verify(a_02);
    return extraout_EAX;
  }
  secp256k1_ge_set_gej_zinv_cold_1();
  a_03->infinity = 1;
  (a_03->x).magnitude = 0;
  (a_03->x).normalized = 1;
  (a_03->x).n[0] = 0;
  (a_03->x).n[1] = 0;
  (a_03->x).n[2] = 0;
  (a_03->x).n[3] = 0;
  (a_03->x).n[4] = 0;
  secp256k1_fe_verify(&a_03->x);
  (a_03->y).magnitude = 0;
  (a_03->y).normalized = 1;
  (a_03->y).n[0] = 0;
  (a_03->y).n[1] = 0;
  (a_03->y).n[2] = 0;
  (a_03->y).n[3] = 0;
  (a_03->y).n[4] = 0;
  secp256k1_fe_verify(&a_03->y);
  secp256k1_ge_verify(a_03);
  return extraout_EAX_00;
}

Assistant:

SECP256K1_INLINE static uint32_t secp256k1_scalar_get_bits_var(const secp256k1_scalar *a, unsigned int offset, unsigned int count) {
    SECP256K1_SCALAR_VERIFY(a);
    VERIFY_CHECK(count > 0 && count <= 32);
    VERIFY_CHECK(offset + count <= 256);

    if ((offset + count - 1) >> 6 == offset >> 6) {
        return secp256k1_scalar_get_bits_limb32(a, offset, count);
    } else {
        VERIFY_CHECK((offset >> 6) + 1 < 4);
        return ((a->d[offset >> 6] >> (offset & 0x3F)) | (a->d[(offset >> 6) + 1] << (64 - (offset & 0x3F)))) & (0xFFFFFFFF >> (32 - count));
    }
}